

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void __thiscall
capnp::_::PointerBuilder::copyFrom(PointerBuilder *this,PointerReader other,bool canonical)

{
  bool bVar1;
  bool canonical_local;
  PointerBuilder *this_local;
  
  if (other.pointer == (WirePointer *)0x0) {
    bVar1 = WirePointer::isNull(this->pointer);
    if (!bVar1) {
      WireHelpers::zeroObject(this->segment,this->capTable,this->pointer);
      WireHelpers::zeroMemory(this->pointer);
    }
  }
  else {
    WireHelpers::copyPointer
              (this->segment,this->capTable,this->pointer,other.segment,other.capTable,other.pointer
               ,other.nestingLimit,(BuilderArena *)0x0,canonical);
  }
  return;
}

Assistant:

void PointerBuilder::copyFrom(PointerReader other, bool canonical) {
  if (other.pointer == nullptr) {
    if (!pointer->isNull()) {
      WireHelpers::zeroObject(segment, capTable, pointer);
      WireHelpers::zeroMemory(pointer);
    }
  } else {
    WireHelpers::copyPointer(segment, capTable, pointer,
                             other.segment, other.capTable, other.pointer, other.nestingLimit,
                             nullptr,
                             canonical);
  }
}